

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

void __thiscall json::Value::stringify(Value *this,ostream *os,bool pretty)

{
  pointer pRVar1;
  bool bVar2;
  char *in_RCX;
  Ref *item;
  pointer pRVar3;
  string_view str;
  string_view str_00;
  stringstream local_1d8 [8];
  stringstream wtf16;
  String local_1c8 [112];
  ios_base local_158 [264];
  long *local_50;
  ostream *local_48;
  long local_40 [2];
  
  if (this->type == Array) {
    local_1d8[0] = (stringstream)0x5b;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1d8,1);
    if (this->type != Array) {
      __assert_fail("isArray()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                    ,0xca,"ArrayStorage &json::Value::getArray()");
    }
    pRVar3 = (((this->field_1).arr)->
             super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pRVar1 = (((this->field_1).arr)->
             super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (pRVar3 != pRVar1) {
      bVar2 = true;
      do {
        if (!bVar2) {
          local_1d8[0] = (stringstream)0x2c;
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1d8,1);
        }
        stringify((pRVar3->super_shared_ptr<json::Value>).
                  super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr,os,pretty);
        pRVar3 = pRVar3 + 1;
        bVar2 = false;
      } while (pRVar3 != pRVar1);
    }
    local_1d8[0] = (stringstream)0x5d;
    std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_1d8,1);
  }
  else {
    if (this->type != String) {
      ::wasm::handle_unreachable
                ("TODO: stringify all of JSON",
                 "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.cpp"
                 ,0x2c);
    }
    std::__cxx11::stringstream::stringstream(local_1d8);
    if (this->type != String) {
      __assert_fail("isString()",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.h"
                    ,0xc2,"IString &json::Value::getIString()");
    }
    str._M_str = in_RCX;
    str._M_len = (size_t)(this->field_1).str.str._M_str;
    bVar2 = ::wasm::String::convertWTF8ToWTF16(local_1c8,(ostream *)(this->field_1).arr,str);
    if (!bVar2) {
      __assert_fail("valid",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.cpp"
                    ,0x1b,"void json::Value::stringify(std::ostream &, bool)");
    }
    std::__cxx11::stringbuf::str();
    str_00._M_str = in_RCX;
    str_00._M_len = (size_t)local_50;
    ::wasm::String::printEscapedJSON((String *)os,local_48,str_00);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    std::__cxx11::stringstream::~stringstream(local_1d8);
    std::ios_base::~ios_base(local_158);
  }
  return;
}

Assistant:

void Value::stringify(std::ostream& os, bool pretty) {
  if (isString()) {
    std::stringstream wtf16;
    [[maybe_unused]] bool valid =
      wasm::String::convertWTF8ToWTF16(wtf16, getIString().str);
    assert(valid);
    // TODO: Use wtf16.view() once we have C++20.
    wasm::String::printEscapedJSON(os, wtf16.str());
  } else if (isArray()) {
    os << '[';
    auto first = true;
    for (auto& item : getArray()) {
      if (first) {
        first = false;
      } else {
        // TODO pretty whitespace
        os << ',';
      }
      item->stringify(os, pretty);
    }
    os << ']';
  } else {
    WASM_UNREACHABLE("TODO: stringify all of JSON");
  }
}